

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cpp
# Opt level: O0

size_t kiste::anon_unknown_6::determine_curly_level(parse_context *ctx,line_data_t *line_data)

{
  bool bVar1;
  reference pcVar2;
  parse_error *this;
  char *c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  size_t level;
  line_data_t *line_data_local;
  parse_context *ctx_local;
  
  __range2 = (string *)ctx->_curly_level;
  ctx_local = (parse_context *)__range2;
  if (line_data->_type == cpp) {
    __end2._M_current = (char *)std::__cxx11::string::begin();
    c = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      if (*pcVar2 == '{') {
        __range2 = (string *)&__range2->field_0x1;
      }
      else if (*pcVar2 == '}') {
        if (__range2 == (string *)0x0) {
          this = (parse_error *)__cxa_allocate_exception(0x10);
          parse_error::parse_error(this,"Too many closing curly braces in C++");
          __cxa_throw(this,&parse_error::typeinfo,parse_error::~parse_error);
        }
        __range2 = (string *)((long)&__range2[-1].field_2 + 0xf);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    ctx_local = (parse_context *)__range2;
  }
  return (size_t)ctx_local;
}

Assistant:

auto determine_curly_level(const parse_context& ctx, const line_data_t& line_data)
        -> std::size_t
    {
      auto level = ctx._curly_level;
      if (line_data._type != line_type::cpp)
      {
        return level;
      }

      for (const auto& c : ctx._line)
      {
        switch (c)
        {
        case '{':
          ++level;
          break;
        case '}':
          if (level == 0)
            throw parse_error("Too many closing curly braces in C++");
          --level;
          break;
        default:
          break;
        }
      }
      return level;
    }